

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::internal::rect
               (cvui_block_t *theBlock,int theX,int theY,int theWidth,int theHeight,
               uint theBorderColor,uint theFillingColor)

{
  int local_54;
  int local_50;
  Size_<int> local_4c;
  Size_<int> local_44;
  Size aSize;
  Rect aRect;
  Point aAnchor;
  uint theBorderColor_local;
  int theHeight_local;
  int theWidth_local;
  int theY_local;
  int theX_local;
  cvui_block_t *theBlock_local;
  
  cv::Point_<int>::Point_((Point_<int> *)&aRect.width,theX,theY);
  cv::Rect_<int>::Rect_((Rect_<int> *)&aSize,theX,theY,theWidth,theHeight);
  if (aRect.x < 0) {
    local_50 = aRect.width + aRect.x;
  }
  else {
    local_50 = aRect.width;
  }
  aSize.width = local_50;
  if (aRect.y < 0) {
    local_54 = aRect.height + aRect.y;
  }
  else {
    local_54 = aRect.height;
  }
  aSize.height = local_54;
  if (aRect.x < 1) {
    aRect.x = -aRect.x;
  }
  if (aRect.y < 1) {
    aRect.y = -aRect.y;
  }
  render::rect(theBlock,(Rect *)&aSize,theBorderColor,theFillingColor);
  cv::Size_<int>::Size_(&local_44,aRect.x,aRect.y);
  cv::Size_<int>::Size_(&local_4c,&local_44);
  updateLayoutFlow(theBlock,&local_4c);
  return;
}

Assistant:

void rect(cvui_block_t& theBlock, int theX, int theY, int theWidth, int theHeight, unsigned int theBorderColor, unsigned int theFillingColor) {
		cv::Point aAnchor(theX, theY);
		cv::Rect aRect(theX, theY, theWidth, theHeight);

		aRect.x = aRect.width < 0 ? aAnchor.x + aRect.width : aAnchor.x;
		aRect.y = aRect.height < 0 ? aAnchor.y + aRect.height : aAnchor.y;
		aRect.width = std::abs(aRect.width);
		aRect.height = std::abs(aRect.height);

		render::rect(theBlock, aRect, theBorderColor, theFillingColor);

		// Update the layout flow
		cv::Size aSize(aRect.width, aRect.height);
		updateLayoutFlow(theBlock, aSize);
	}